

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O3

void __thiscall yyFlexLexer::yy_flush_buffer(yyFlexLexer *this,YY_BUFFER_STATE b)

{
  yy_buffer_state *pyVar1;
  char *pcVar2;
  YY_BUFFER_STATE pyVar3;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    pyVar3 = (YY_BUFFER_STATE)0x0;
    b->yy_n_chars = 0;
    *b->yy_ch_buf = '\0';
    b->yy_ch_buf[1] = '\0';
    b->yy_buf_pos = b->yy_ch_buf;
    b->yy_at_bol = 1;
    b->yy_buffer_status = 0;
    if (this->yy_buffer_stack != (yy_buffer_state **)0x0) {
      pyVar3 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    }
    if (pyVar3 == b) {
      pyVar1 = this->yy_buffer_stack[this->yy_buffer_stack_top];
      this->yy_n_chars = pyVar1->yy_n_chars;
      pcVar2 = pyVar1->yy_buf_pos;
      this->yy_c_buf_p = pcVar2;
      (this->super_FlexLexer).yytext = pcVar2;
      std::ios::rdbuf((streambuf *)(&this->yyin + *(long *)(*(long *)&this->yyin + -0x18)));
      this->yy_hold_char = *this->yy_c_buf_p;
      return;
    }
  }
  return;
}

Assistant:

void yyFlexLexer::yy_flush_buffer( YY_BUFFER_STATE b )
/* %endif */
{
    	if ( ! b )
		return;

	b->yy_n_chars = 0;

	/* We always need two end-of-buffer characters.  The first causes
	 * a transition to the end-of-buffer state.  The second causes
	 * a jam in that state.
	 */
	b->yy_ch_buf[0] = YY_END_OF_BUFFER_CHAR;
	b->yy_ch_buf[1] = YY_END_OF_BUFFER_CHAR;

	b->yy_buf_pos = &b->yy_ch_buf[0];

	b->yy_at_bol = 1;
	b->yy_buffer_status = YY_BUFFER_NEW;

	if ( b == YY_CURRENT_BUFFER )
		yy_load_buffer_state(  );
}